

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O0

void ppu_cpu_bus(nes_system *system)

{
  byte bVar1;
  uint8_t reg_addr;
  nes_system_state *state;
  nes_system *system_local;
  
  if ((((system->state).cpu.rw_mode == '\x01') && (0x1fff < (system->state).cpu.address)) &&
     ((system->state).cpu.address < 0x4000)) {
    bVar1 = (byte)(system->state).cpu.address & 7;
    (system->state).cpu.data = (system->state).ppu.reg_data;
    (system->state).cached_ppu_reg[bVar1] = (system->state).ppu.reg_data;
    if (((system->config).memory_callback !=
         (_func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *)0x0) &&
       ((*(system->config).memory_callback)
                  (NES_MEMORY_TYPE_CPU,NES_MEMORY_OP_READ,(system->state).cpu.address,
                   &(system->state).cpu.data,(system->config).client_data), bVar1 == 4)) {
      (*(system->config).memory_callback)
                (NES_MEMORY_TYPE_OAM,NES_MEMORY_OP_READ,(uint16_t)(system->state).ppu.oam_address,
                 &(system->state).ppu.reg_data,(system->config).client_data);
    }
  }
  return;
}

Assistant:

static void ppu_cpu_bus(nes_system* system)
{
    nes_system_state* state = &system->state;

    if (state->cpu.rw_mode == CPU_RW_MODE_READ && state->cpu.address >= 0x2000 && state->cpu.address <= 0x3FFF)
    {
        uint8_t reg_addr = state->cpu.address & 7;

        state->cpu.data = state->ppu.reg_data;
        state->cached_ppu_reg[reg_addr] = state->ppu.reg_data;

        if (system->config.memory_callback)
        {
            system->config.memory_callback(NES_MEMORY_TYPE_CPU, NES_MEMORY_OP_READ, state->cpu.address, &state->cpu.data, system->config.client_data);

            if (reg_addr == NES_PPU_OAM_DATA_REG_ID)
                system->config.memory_callback(NES_MEMORY_TYPE_OAM, NES_MEMORY_OP_READ, state->ppu.oam_address, &state->ppu.reg_data, system->config.client_data);
        }
    }
}